

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

void __thiscall SQVM::SQVM(SQVM *this,SQSharedState *ss)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  
  (this->super_SQCollectable).super_SQRefCounted._uiRef = 0;
  (this->super_SQCollectable).super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQVM_0018d738;
  (this->_stack)._vals = (SQObjectPtr *)0x0;
  (this->_stack)._size = 0;
  (this->_stack)._allocated = 0;
  (this->_roottable).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_roottable).super_SQObject._type = OT_NULL;
  (this->_lasterror).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_lasterror).super_SQObject._type = OT_NULL;
  (this->_errorhandler).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_errorhandler).super_SQObject._type = OT_NULL;
  (this->_debughook_closure).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_debughook_closure).super_SQObject._type = OT_NULL;
  (this->temp_reg).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->temp_reg).super_SQObject._type = OT_NULL;
  (this->_etraps)._size = 0;
  (this->_etraps)._allocated = 0;
  (this->_callstackdata)._allocated = 0;
  (this->_etraps)._vals = (SQExceptionTrap *)0x0;
  (this->_callstackdata)._vals = (CallInfo *)0x0;
  (this->_callstackdata)._size = 0;
  this->_sharedstate = ss;
  this->_suspended = 0;
  this->_suspended_target = -1;
  this->_suspended_root = 0;
  this->_suspended_traps = -1;
  this->_foreignptr = (SQUserPointer)0x0;
  this->_nnativecalls = 0;
  this->_nmetamethodscall = 0;
  (this->_lasterror).super_SQObject._type = OT_NULL;
  (this->_lasterror).super_SQObject._unVal.pTable = (SQTable *)0x0;
  SVar2 = (this->_errorhandler).super_SQObject._type;
  (this->_errorhandler).super_SQObject._type = OT_NULL;
  (this->_errorhandler).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if (((SVar2 >> 0x1b & 1) != 0) && (_DAT_00000008 = _DAT_00000008 + -1, _DAT_00000008 == 0)) {
    (**(code **)(_DAT_00000000 + 0x10))(0);
  }
  this->_debughook = false;
  this->_debughook_native = (SQDEBUGHOOK)0x0;
  pSVar3 = (this->_debughook_closure).super_SQObject._unVal.pTable;
  SVar2 = (this->_debughook_closure).super_SQObject._type;
  (this->_debughook_closure).super_SQObject._type = OT_NULL;
  (this->_debughook_closure).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  this->_openouters = (SQOuter *)0x0;
  this->ci = (CallInfo *)0x0;
  this->_releasehook = (SQRELEASEHOOK)0x0;
  (this->super_SQCollectable)._next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._prev = (SQCollectable *)0x0;
  this->_sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQVM::SQVM(SQSharedState *ss)
{
    _sharedstate=ss;
    _suspended = SQFalse;
    _suspended_target = -1;
    _suspended_root = SQFalse;
    _suspended_traps = -1;
    _foreignptr = NULL;
    _nnativecalls = 0;
    _nmetamethodscall = 0;
    _lasterror.Null();
    _errorhandler.Null();
    _debughook = false;
    _debughook_native = NULL;
    _debughook_closure.Null();
    _openouters = NULL;
    ci = NULL;
    _releasehook = NULL;
    INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this);
}